

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O0

size_t __thiscall leveldb::RecoveryTest::DeleteLogFiles(RecoveryTest *this)

{
  Env *pEVar1;
  ulong uVar2;
  size_type sVar3;
  Tester *this_00;
  undefined1 local_228 [32];
  RecoveryTest local_208;
  Tester local_1d0;
  ulong local_30;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> logs;
  RecoveryTest *this_local;
  
  logs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  Close(this);
  GetFiles((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,this,kLogFile);
  local_30 = 0;
  while( true ) {
    uVar2 = local_30;
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
    if (sVar3 <= uVar2) break;
    test::Tester::Tester
              (&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
               ,0x67);
    pEVar1 = this->env_;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,local_30);
    LogName_abi_cxx11_((RecoveryTest *)(local_228 + 0x20),(uint64_t)this);
    (*pEVar1->_vptr_Env[8])(&local_208.env_,pEVar1,local_228 + 0x20);
    this_00 = test::Tester::IsOk(&local_1d0,(Status *)&local_208.env_);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,local_30);
    LogName_abi_cxx11_((RecoveryTest *)local_228,(uint64_t)this);
    test::Tester::operator<<
              (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_228);
    std::__cxx11::string::~string((string *)local_228);
    Status::~Status((Status *)&local_208.env_);
    std::__cxx11::string::~string((string *)(local_228 + 0x20));
    test::Tester::~Tester(&local_1d0);
    local_30 = local_30 + 1;
  }
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
  return sVar3;
}

Assistant:

size_t DeleteLogFiles() {
    // Linux allows unlinking open files, but Windows does not.
    // Closing the db allows for file deletion.
    Close();
    std::vector<uint64_t> logs = GetFiles(kLogFile);
    for (size_t i = 0; i < logs.size(); i++) {
      ASSERT_OK(env_->DeleteFile(LogName(logs[i]))) << LogName(logs[i]);
    }
    return logs.size();
  }